

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCaseInfo::operator==(TestCaseInfo *this,TestCaseInfo *other)

{
  size_t sVar1;
  int iVar2;
  
  if ((this->m_test).m_p != (other->m_test).m_p) {
    return false;
  }
  sVar1 = (this->m_name)._M_string_length;
  if ((sVar1 == (other->m_name)._M_string_length) &&
     (((sVar1 == 0 ||
       (iVar2 = bcmp((this->m_name)._M_dataplus._M_p,(other->m_name)._M_dataplus._M_p,sVar1),
       iVar2 == 0)) &&
      (sVar1 = (this->m_className)._M_string_length, sVar1 == (other->m_className)._M_string_length)
      ))) {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->m_className)._M_dataplus._M_p,(other->m_className)._M_dataplus._M_p,sVar1)
      ;
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

const T* get() const{
            return m_p;
        }